

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::doAppend
          (UnicodeString *this,UnicodeString *src,int32_t srcStart,int32_t srcLength)

{
  char16_t *srcChars;
  int32_t local_28;
  int32_t local_24;
  int32_t srcLength_local;
  int32_t srcStart_local;
  UnicodeString *src_local;
  UnicodeString *this_local;
  
  this_local = this;
  if (srcLength != 0) {
    local_28 = srcLength;
    local_24 = srcStart;
    _srcLength_local = src;
    src_local = this;
    pinIndices(src,&local_24,&local_28);
    srcChars = getArrayStart(_srcLength_local);
    this_local = doAppend(this,srcChars,local_24,local_28);
  }
  return this_local;
}

Assistant:

UnicodeString&
UnicodeString::doAppend(const UnicodeString& src, int32_t srcStart, int32_t srcLength) {
  if(srcLength == 0) {
    return *this;
  }

  // pin the indices to legal values
  src.pinIndices(srcStart, srcLength);
  return doAppend(src.getArrayStart(), srcStart, srcLength);
}